

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall
mjs::property_name_and_value::property_name_and_value
          (property_name_and_value *this,property_name_and_value *param_1)

{
  property_name_and_value *param_1_local;
  property_name_and_value *this_local;
  
  this->type_ = param_1->type_;
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::unique_ptr
            (&this->name_,&param_1->name_);
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::unique_ptr
            (&this->value_,&param_1->value_);
  return;
}

Assistant:

explicit property_name_and_value(property_assignment_type type, expression_ptr&& name, expression_ptr&& value)
        : type_{type}
        , name_{std::move(name)}
        , value_{std::move(value)} {
        assert(name_ && value_);
        assert(is_valid_property_name_expression(*name_));
        assert(type == property_assignment_type::normal || value_->type() == expression_type::function);
    }